

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

char * Diligent::GetDeviceFeatureStateString(DEVICE_FEATURE_STATE State,bool bGetFullName)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  undefined7 in_register_00000039;
  char (*in_R8) [2];
  string msg;
  uint local_2c;
  string local_28;
  
  iVar3 = (int)CONCAT71(in_register_00000039,State);
  if (iVar3 == 2) {
    pcVar2 = "DEVICE_FEATURE_STATE_OPTIONAL";
    pcVar1 = "Optional";
  }
  else if (iVar3 == 1) {
    pcVar2 = "DEVICE_FEATURE_STATE_ENABLED";
    pcVar1 = "Enabled";
  }
  else {
    if (iVar3 != 0) {
      local_2c = (uint)State;
      FormatString<char[34],unsigned_int,char[2]>
                (&local_28,(Diligent *)"Unexpected device feature state (",(char (*) [34])&local_2c,
                 (uint *)0x73bf31,in_R8);
      DebugAssertionFailed
                (local_28._M_dataplus._M_p,"GetDeviceFeatureStateString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x622);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_28._M_dataplus._M_p != &local_28.field_2) {
        operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
      }
      return "UNKNOWN";
    }
    pcVar2 = "DEVICE_FEATURE_STATE_DISABLED";
    pcVar1 = "Disabled";
  }
  if (bGetFullName) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const char* GetDeviceFeatureStateString(DEVICE_FEATURE_STATE State, bool bGetFullName)
{
    switch (State)
    {
        // clang-format off
        case DEVICE_FEATURE_STATE_DISABLED: return bGetFullName ? "DEVICE_FEATURE_STATE_DISABLED" : "Disabled";
        case DEVICE_FEATURE_STATE_OPTIONAL: return bGetFullName ? "DEVICE_FEATURE_STATE_OPTIONAL" : "Optional";
        case DEVICE_FEATURE_STATE_ENABLED:  return bGetFullName ? "DEVICE_FEATURE_STATE_ENABLED"  : "Enabled";
        // clang-format on
        default:
            UNEXPECTED("Unexpected device feature state (", Uint32{State}, ")");
            return "UNKNOWN";
    }
}